

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseConstList(WastParser *this,ConstVector *consts)

{
  bool bVar1;
  Result RVar2;
  Token local_b8;
  undefined1 local_68 [8];
  Const const_;
  
  while( true ) {
    bVar1 = PeekMatchLpar(this,Const);
    if (!bVar1) {
      return (Result)Ok;
    }
    Consume(&local_b8,this);
    Token::~Token(&local_b8);
    Const::Const((Const *)local_68);
    RVar2 = ParseConst(this,(Const *)local_68);
    if ((RVar2.enum_ == Error) || (RVar2 = Expect(this,Rpar), RVar2.enum_ == Error)) break;
    std::vector<wabt::Const,_std::allocator<wabt::Const>_>::push_back(consts,(Const *)local_68);
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseConstList(ConstVector* consts) {
  WABT_TRACE(ParseConstList);
  while (PeekMatchLpar(TokenType::Const)) {
    Consume();
    Const const_;
    CHECK_RESULT(ParseConst(&const_));
    EXPECT(Rpar);
    consts->push_back(const_);
  }

  return Result::Ok;
}